

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrBasic.c
# Opt level: O0

MtrNode * Mtr_CreateFirstChild(MtrNode *parent)

{
  MtrNode *child;
  MtrNode *parent_local;
  
  parent_local = Mtr_AllocNode();
  if (parent_local == (MtrNode *)0x0) {
    parent_local = (MtrNode *)0x0;
  }
  else {
    parent_local->elder = (MtrNode *)0x0;
    parent_local->younger = (MtrNode *)0x0;
    parent_local->child = (MtrNode *)0x0;
    parent_local->flags = 0;
    Mtr_MakeFirstChild(parent,parent_local);
  }
  return parent_local;
}

Assistant:

MtrNode *
Mtr_CreateFirstChild(
  MtrNode * parent)
{
    MtrNode *child;

    child = Mtr_AllocNode();
    if (child == NULL) return(NULL);

    child->child = child->younger = child-> elder = NULL;
    child->flags = 0;
    Mtr_MakeFirstChild(parent,child);
    return(child);

}